

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall QGraphicsDropShadowEffect::setColor(QGraphicsDropShadowEffect *this,QColor *color)

{
  QGraphicsDropShadowEffectPrivate *this_00;
  ulong uVar1;
  QPixmapDropShadowFilter *in_RSI;
  QColor *in_RDI;
  long in_FS_OFFSET;
  QColor QVar2;
  QGraphicsDropShadowEffectPrivate *d;
  QColor local_28;
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsDropShadowEffect *)0x4a4e7e);
  QVar2 = QPixmapDropShadowFilter::color(in_RSI);
  local_28._0_8_ = QVar2._0_8_;
  local_18._0_8_ = local_28._0_8_;
  local_28.ct._4_4_ = QVar2.ct._4_4_;
  local_18.ct._4_4_ = local_28.ct._4_4_;
  local_28.ct._8_2_ = QVar2.ct._8_2_;
  local_18.ct.argb.pad = local_28.ct._8_2_;
  uVar1 = QColor::operator==(&local_18,(QColor *)in_RSI);
  if ((uVar1 & 1) == 0) {
    QPixmapDropShadowFilter::setColor((QPixmapDropShadowFilter *)this_00,in_RDI);
    QGraphicsEffect::update((QGraphicsEffect *)this_00);
    colorChanged((QGraphicsDropShadowEffect *)this_00,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsDropShadowEffect::setColor(const QColor &color)
{
    Q_D(QGraphicsDropShadowEffect);
    if (d->filter->color() == color)
        return;

    d->filter->setColor(color);
    update();
    emit colorChanged(color);
}